

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegls.cpp
# Opt level: O1

vector<signed_char,_std::allocator<signed_char>_> *
charls::anon_unknown_82::create_quantize_lut_lossless
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,
          int32_t bit_count)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  pointer pcVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  char cVar10;
  uint uVar11;
  allocator_type local_29;
  
  if (0xf < bit_count - 1U) {
    __assert_fail("bits_per_sample > 0 && bits_per_sample <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/util.h"
                  ,0x1a7,"int32_t charls::calculate_maximum_sample_value(const int32_t)");
  }
  uVar11 = -1 << ((byte)bit_count & 0x1f);
  if (uVar11 < 0xffff0000) {
    __assert_fail("maximum_sample_value <= std::numeric_limits<uint16_t>::max()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpegls_preset_coding_parameters.h"
                  ,0x18,"jpegls_pc_parameters charls::compute_default(const int32_t, const int32_t)"
                 );
  }
  uVar7 = ~uVar11;
  if (uVar11 < 0xffffff80) {
    uVar2 = 0xfff;
    if ((int)uVar7 < 0xfff) {
      uVar2 = uVar7;
    }
    uVar6 = uVar2 + 0x80 >> 8;
    uVar4 = uVar6 + 2;
    uVar3 = 1;
    if (1 < uVar4) {
      uVar3 = uVar4;
    }
    if (uVar7 < uVar4) {
      uVar3 = 1;
    }
    uVar2 = uVar2 + 0x80 >> 6 | 3;
    uVar4 = uVar3;
    if (uVar3 < uVar2) {
      uVar4 = uVar2;
    }
    if (uVar7 < uVar2) {
      uVar4 = uVar3;
    }
    uVar2 = uVar6 * 0x11 + 4;
    uVar6 = uVar4;
    if (uVar4 < uVar2) {
      uVar6 = uVar2;
    }
  }
  else {
    uVar1 = 0x100 / (ulong)-uVar11;
    uVar3 = (uint)(3 / uVar1);
    uVar2 = 2;
    if (2 < uVar3) {
      uVar2 = uVar3;
    }
    uVar3 = 1;
    if (uVar2 <= uVar7) {
      uVar3 = uVar2;
    }
    uVar4 = (uint)(7 / uVar1);
    uVar2 = 3;
    if (3 < uVar4) {
      uVar2 = uVar4;
    }
    uVar4 = uVar3;
    if (uVar3 < uVar2) {
      uVar4 = uVar2;
    }
    if (uVar7 < uVar2) {
      uVar4 = uVar3;
    }
    uVar6 = (uint)(0x15 / uVar1);
    uVar2 = 4;
    if (4 < uVar6) {
      uVar2 = uVar6;
    }
    uVar6 = uVar4;
    if (uVar4 < uVar2) {
      uVar6 = uVar2;
    }
  }
  if (uVar7 < uVar2) {
    uVar6 = uVar4;
  }
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (__return_storage_ptr__,(ulong)(uint)(2 << ((byte)bit_count & 0x1f)),&local_29);
  pcVar5 = (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
      _M_impl.super__Vector_impl_data._M_finish != pcVar5) {
    lVar8 = 0;
    do {
      iVar9 = uVar11 + (int)lVar8;
      cVar10 = -4;
      if (((iVar9 != -uVar6 && SBORROW4(iVar9,-uVar6) == (int)(iVar9 + uVar6) < 0) &&
          (cVar10 = -3, iVar9 != -uVar4 && SBORROW4(iVar9,-uVar4) == (int)(iVar9 + uVar4) < 0)) &&
         (cVar10 = -2, iVar9 != -uVar3 && SBORROW4(iVar9,-uVar3) == (int)(iVar9 + uVar3) < 0)) {
        if (iVar9 < 0) {
          cVar10 = -1;
        }
        else if (iVar9 == 0) {
          cVar10 = '\0';
        }
        else {
          cVar10 = '\x01';
          if (((int)uVar3 <= iVar9) && (cVar10 = '\x02', (int)uVar4 <= iVar9)) {
            cVar10 = '\x04' - (iVar9 < (int)uVar6);
          }
        }
      }
      pcVar5[lVar8] = cVar10;
      lVar8 = lVar8 + 1;
      pcVar5 = (__return_storage_ptr__->
               super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar8 != (long)(__return_storage_ptr__->
                            super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pcVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int8_t> create_quantize_lut_lossless(const int32_t bit_count)
{
    const jpegls_pc_parameters preset{compute_default(calculate_maximum_sample_value(bit_count), 0)};
    const int32_t range{preset.maximum_sample_value + 1};

    vector<int8_t> lut(static_cast<size_t>(range) * 2);
    for (size_t i{}; i != lut.size(); ++i)
    {
        lut[i] = quantize_gradient_org(preset, static_cast<int32_t>(i) - range);
    }

    return lut;
}